

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shmobject.cpp
# Opt level: O3

PAL_ERROR __thiscall
CorUnix::CSharedMemoryWaitableObject::GetSynchWaitController
          (CSharedMemoryWaitableObject *this,CPalThread *pthr,
          ISynchWaitController **ppWaitController)

{
  PAL_ERROR PVar1;
  
  if (pthr == (CPalThread *)0x0) {
    fprintf(_stderr,"] %s %s:%d","GetSynchWaitController",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/objmgr/shmobject.cpp"
            ,0x57e);
    fprintf(_stderr,"Expression: NULL != pthr\n");
  }
  if (ppWaitController == (ISynchWaitController **)0x0) {
    fprintf(_stderr,"] %s %s:%d","GetSynchWaitController",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/objmgr/shmobject.cpp"
            ,0x57f);
    fprintf(_stderr,"Expression: NULL != ppWaitController\n");
  }
  if (PAL_InitializeChakraCoreCalled != false) {
    (**(code **)(*g_pSynchronizationManager + 0x50))(g_pSynchronizationManager,pthr);
    PVar1 = (**(code **)(*g_pSynchronizationManager + 0x68))
                      (g_pSynchronizationManager,pthr,
                       (this->super_CSharedMemoryObject).super_CPalObjectBase.m_pot,
                       this->m_pvSynchData,(this->super_CSharedMemoryObject).m_ObjectDomain,
                       ppWaitController);
    (**(code **)(*g_pSynchronizationManager + 0x58))(g_pSynchronizationManager,pthr);
    if (PAL_InitializeChakraCoreCalled != false) {
      return PVar1;
    }
  }
  abort();
}

Assistant:

PAL_ERROR
CSharedMemoryWaitableObject::GetSynchWaitController(
    CPalThread *pthr,                // IN, OPTIONAL
    ISynchWaitController **ppWaitController    // OUT
    )
{
    PAL_ERROR palError = NO_ERROR;

    _ASSERTE(NULL != pthr);
    _ASSERTE(NULL != ppWaitController);

    ENTRY("CSharedMemoryWaitableObject::GetSynchWaitController"
        "(this = %p, pthr = %p, ppWaitController = %p",
        this,
        pthr,
        ppWaitController
        );

    //
    // We need to grab the local synch lock before creating the controller
    // (otherwise we could get promoted after passing in our parameters)
    //

    g_pSynchronizationManager->AcquireProcessLock(pthr);

    palError = g_pSynchronizationManager->CreateSynchWaitController(
        pthr,
        m_pot,
        m_pvSynchData,
        m_ObjectDomain,
        ppWaitController
        );

    g_pSynchronizationManager->ReleaseProcessLock(pthr);

    LOGEXIT("CSharedMemoryWaitableObject::GetSynchWaitController returns %d\n",
        palError
        );

    return palError;
}